

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_1730dca::HandleArchiveExtractCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  Status SVar7;
  offset_in_Arguments_to_MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  member;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  cmWorkingDirectory workdir;
  string destDir;
  string inFile;
  Arguments parsedArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unrecognizedArguments;
  undefined1 local_1e0 [32];
  int local_1c0;
  string local_1b8;
  string local_198;
  string local_178;
  undefined1 local_158 [16];
  pointer local_148;
  _Any_data _Stack_140;
  _Manager_type p_Stack_130;
  _Invoker_type local_128;
  undefined1 auStack_120 [16];
  _Manager_type p_Stack_110;
  undefined8 local_108;
  string sStack_100;
  undefined1 local_e0 [24];
  byte local_c8;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  char *pcStack_70;
  pointer local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_60;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type p_Stack_40;
  bool local_38;
  
  if ((anonymous_namespace)::
      HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::parser == '\0') {
    iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                 ::parser);
    if (iVar5 != 0) {
      sStack_100._M_string_length = 0;
      sStack_100.field_2._M_allocated_capacity = 0;
      local_108 = (_Invoker_type)0x0;
      sStack_100._M_dataplus._M_p = (pointer)0x0;
      auStack_120._8_8_ = 0;
      p_Stack_110 = (_Manager_type)0x0;
      local_128 = (_Invoker_type)0x0;
      auStack_120._0_8_ = (void *)0x0;
      _Stack_140._8_8_ = (_Base_ptr)0x0;
      p_Stack_130 = (_Manager_type)0x0;
      local_148 = (pointer)0x0;
      _Stack_140._M_unused._M_object = (_Base_ptr)0x0;
      local_158._0_8_ = 0;
      local_158._8_8_ = 0;
      name.super_string_view._M_str = "INPUT";
      name.super_string_view._M_len = 5;
      cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)local_158,name,0x30);
      name_00.super_string_view._M_str = "VERBOSE";
      name_00.super_string_view._M_len = 7;
      cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_158,name_00,0x50)
      ;
      name_01.super_string_view._M_str = "LIST_ONLY";
      name_01.super_string_view._M_len = 9;
      cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_158,name_01,0x51)
      ;
      member = 0x58;
      name_02.super_string_view._M_str = "DESTINATION";
      name_02.super_string_view._M_len = 0xb;
      cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)local_158,name_02,0x58);
      name_03.super_string_view._M_str = "PATTERNS";
      name_03.super_string_view._M_len = 8;
      cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::
      Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)local_158,name_03,member);
      name_04.super_string_view._M_str = "TOUCH";
      name_04.super_string_view._M_len = 5;
      cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_158,name_04,0x90)
      ;
      ArgumentParser::ActionMap::ActionMap
                ((ActionMap *)&HandleArchiveExtractCommand::parser,(ActionMap *)local_158);
      ArgumentParser::Base::~Base((Base *)local_158);
      __cxa_atexit(ArgumentParser::Base::~Base,&HandleArchiveExtractCommand::parser,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
  }
  local_98._16_8_ = local_b8;
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = (pointer)0x0;
  local_b8._16_8_ = (pointer)0x0;
  local_1e0._8_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_1e0._0_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 1;
  _Stack_140._M_unused._0_8_ = (undefined8)(local_158 + 8);
  local_158._8_8_ = local_158._8_8_ & 0xffffffff00000000;
  local_148 = (pointer)0x0;
  p_Stack_130 = (_Manager_type)0x0;
  auStack_120._0_8_ = (void *)0x0;
  auStack_120._8_8_ = auStack_120._8_8_ & 0xffffffffffffff00;
  local_108 = (_Invoker_type)((ulong)local_108 & 0xffffffffffff0000);
  sStack_100._M_string_length = 0;
  sStack_100.field_2._M_allocated_capacity =
       sStack_100.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_e0._0_8_ = (pointer)0x0;
  local_e0[8] = 0;
  local_e0._9_7_ = 0;
  local_e0[0x10] = 0;
  stack0xffffffffffffff31 = 0;
  local_98._0_8_ = &HandleArchiveExtractCommand::parser;
  local_98._8_8_ = local_158;
  local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  pcStack_70 = (char *)0x0;
  local_68 = (pointer)0x0;
  paStack_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (_Manager_type)0x0;
  p_Stack_40 = (_Invoker_type)0x0;
  local_38 = false;
  _Stack_140._8_8_ = _Stack_140._M_unused._M_object;
  local_128 = (_Invoker_type)(auStack_120 + 8);
  sStack_100._M_dataplus._M_p = (pointer)&sStack_100.field_2;
  local_98._24_8_ = local_98._8_8_;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)local_98,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_1e0,0);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_b8._0_8_ != local_b8._8_8_) {
    local_98._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x18;
    local_98._8_8_ = "Unrecognized argument: \"";
    local_98._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((_Alloc_hider *)local_b8._0_8_)->_M_p;
    local_98._24_8_ = *(size_type *)(local_b8._0_8_ + 8);
    pcStack_70 = (char *)0x0;
    local_68 = (pointer)&DAT_00000001;
    paStack_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x9744ec;
    local_58._M_unused._M_object = (void *)0x0;
    views._M_len = 3;
    views._M_array = (iterator)local_98;
    cmCatViews((string *)local_1e0,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((pointer)local_1e0._0_8_ != (pointer)(local_1e0 + 0x10)) {
      operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
    }
    cmSystemTools::s_FatalErrorOccurred = true;
    bVar3 = false;
    goto LAB_0044f3aa;
  }
  bVar3 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_158,status->Makefile);
  if (bVar3) {
    cmSystemTools::s_FatalErrorOccurred = true;
    bVar3 = true;
    goto LAB_0044f3aa;
  }
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,local_128,(_Invoker_type)(auStack_120._0_8_ + (long)local_128));
  if (local_108._1_1_ == '\x01') {
    bVar4 = cmSystemTools::ListTar
                      (&local_198,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_e0,local_108._0_1_);
    bVar3 = true;
    if (!bVar4) {
      local_98._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x10;
      local_98._8_8_ = "failed to list: ";
      local_98._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_98._24_8_ = local_198._M_string_length;
      local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_198._M_dataplus._M_p;
      pcStack_70 = (char *)0x0;
      views_00._M_len = 2;
      views_00._M_array = (iterator)local_98;
      cmCatViews((string *)local_1e0,views_00);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((pointer)local_1e0._0_8_ != (pointer)(local_1e0 + 0x10)) {
        operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
      }
      cmSystemTools::s_FatalErrorOccurred = true;
      goto LAB_0044f38c;
    }
  }
  else {
    psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(status->Makefile);
    paVar1 = &local_1b8.field_2;
    pcVar2 = (psVar6->_M_dataplus)._M_p;
    local_1b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,pcVar2,pcVar2 + psVar6->_M_string_length);
    if ((pointer)sStack_100._M_string_length == (pointer)0x0) {
LAB_0044f22f:
      cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)local_1e0,&local_1b8);
      if (local_1c0 == 0) {
        bVar3 = cmSystemTools::ExtractTar
                          (&local_198,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_e0,(uint)local_c8,local_108._0_1_);
        if (bVar3) {
          cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_1e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          bVar3 = true;
          goto LAB_0044f38e;
        }
        local_98._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x13;
        local_98._8_8_ = "failed to extract: ";
        local_98._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_98._24_8_ = local_198._M_string_length;
        local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_198._M_dataplus._M_p;
        pcStack_70 = (char *)0x0;
        views_04._M_len = 2;
        views_04._M_array = (iterator)local_98;
        cmCatViews(&local_178,views_04);
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else {
        local_98._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x27;
        local_98._8_8_ = "failed to change working directory to: ";
        local_98._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_98._24_8_ = local_1b8._M_string_length;
        local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_1b8._M_dataplus._M_p;
        pcStack_70 = (char *)0x0;
        views_03._M_len = 2;
        views_03._M_array = (iterator)local_98;
        cmCatViews(&local_178,views_03);
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      cmSystemTools::s_FatalErrorOccurred = true;
      cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_1e0);
    }
    else {
      bVar3 = cmsys::SystemTools::FileIsFullPath(&sStack_100);
      if (bVar3) {
        std::__cxx11::string::_M_assign((string *)&local_1b8);
      }
      else {
        local_98._0_8_ = local_1b8._M_string_length;
        local_98._8_8_ = local_1b8._M_dataplus._M_p;
        local_98._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_98._24_8_ = &DAT_00000001;
        local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x9e80a1;
        pcStack_70 = (char *)0x0;
        local_68 = (pointer)sStack_100._M_string_length;
        paStack_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)sStack_100._M_dataplus._M_p;
        local_58._M_unused._M_object = (void *)0x0;
        views_01._M_len = 3;
        views_01._M_array = (iterator)local_98;
        cmCatViews((string *)local_1e0,views_01);
        std::__cxx11::string::operator=((string *)&local_1b8,(string *)local_1e0);
        if ((pointer)local_1e0._0_8_ != (pointer)(local_1e0 + 0x10)) {
          operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
        }
      }
      SVar7 = cmsys::SystemTools::MakeDirectory(&local_1b8,(mode_t *)0x0);
      if (SVar7.Kind_ == Success) {
        bVar3 = cmsys::SystemTools::FileIsFullPath(&local_198);
        if (!bVar3) {
          cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
          cmStrCat<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                    ((string *)local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                     (char (*) [2])0x9e80a1,&local_198);
          std::__cxx11::string::operator=((string *)&local_198,(string *)local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_98 + 0x10)) {
            operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
          }
          if ((pointer)local_1e0._0_8_ != (pointer)(local_1e0 + 0x10)) {
            operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
          }
        }
        goto LAB_0044f22f;
      }
      local_98._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1c;
      local_98._8_8_ = "failed to create directory: ";
      local_98._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_98._24_8_ = local_1b8._M_string_length;
      local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_1b8._M_dataplus._M_p;
      pcStack_70 = (char *)0x0;
      views_02._M_len = 2;
      views_02._M_array = (iterator)local_98;
      cmCatViews((string *)local_1e0,views_02);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((pointer)local_1e0._0_8_ != (pointer)(local_1e0 + 0x10)) {
        operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
      }
      cmSystemTools::s_FatalErrorOccurred = true;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
LAB_0044f38c:
    bVar3 = false;
  }
LAB_0044f38e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
LAB_0044f3aa:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_100._M_dataplus._M_p != &sStack_100.field_2) {
    operator_delete(sStack_100._M_dataplus._M_p,sStack_100.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != (_Invoker_type)(auStack_120 + 8)) {
    operator_delete(local_128,auStack_120._8_8_ + 1);
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_158);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b8);
  return bVar3;
}

Assistant:

bool HandleArchiveExtractCommand(std::vector<std::string> const& args,
                                 cmExecutionStatus& status)
{
  struct Arguments : public ArgumentParser::ParseResult
  {
    std::string Input;
    bool Verbose = false;
    bool ListOnly = false;
    std::string Destination;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Patterns;
    bool Touch = false;
  };

  static auto const parser = cmArgumentParser<Arguments>{}
                               .Bind("INPUT"_s, &Arguments::Input)
                               .Bind("VERBOSE"_s, &Arguments::Verbose)
                               .Bind("LIST_ONLY"_s, &Arguments::ListOnly)
                               .Bind("DESTINATION"_s, &Arguments::Destination)
                               .Bind("PATTERNS"_s, &Arguments::Patterns)
                               .Bind("TOUCH"_s, &Arguments::Touch);

  std::vector<std::string> unrecognizedArguments;
  auto parsedArgs =
    parser.Parse(cmMakeRange(args).advance(1), &unrecognizedArguments);
  auto argIt = unrecognizedArguments.begin();
  if (argIt != unrecognizedArguments.end()) {
    status.SetError(cmStrCat("Unrecognized argument: \"", *argIt, "\""));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (parsedArgs.MaybeReportError(status.GetMakefile())) {
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }

  std::string inFile = parsedArgs.Input;

  if (parsedArgs.ListOnly) {
    if (!cmSystemTools::ListTar(inFile, parsedArgs.Patterns,
                                parsedArgs.Verbose)) {
      status.SetError(cmStrCat("failed to list: ", inFile));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  } else {
    std::string destDir = status.GetMakefile().GetCurrentBinaryDirectory();
    if (!parsedArgs.Destination.empty()) {
      if (cmSystemTools::FileIsFullPath(parsedArgs.Destination)) {
        destDir = parsedArgs.Destination;
      } else {
        destDir = cmStrCat(destDir, "/", parsedArgs.Destination);
      }

      if (!cmSystemTools::MakeDirectory(destDir)) {
        status.SetError(cmStrCat("failed to create directory: ", destDir));
        cmSystemTools::SetFatalErrorOccurred();
        return false;
      }

      if (!cmSystemTools::FileIsFullPath(inFile)) {
        inFile =
          cmStrCat(cmSystemTools::GetCurrentWorkingDirectory(), "/", inFile);
      }
    }

    cmWorkingDirectory workdir(destDir);
    if (workdir.Failed()) {
      status.SetError(
        cmStrCat("failed to change working directory to: ", destDir));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }

    if (!cmSystemTools::ExtractTar(
          inFile, parsedArgs.Patterns,
          parsedArgs.Touch ? cmSystemTools::cmTarExtractTimestamps::No
                           : cmSystemTools::cmTarExtractTimestamps::Yes,
          parsedArgs.Verbose)) {
      status.SetError(cmStrCat("failed to extract: ", inFile));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  }

  return true;
}